

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_pushstring(lua_State *L,char *str)

{
  undefined4 *puVar1;
  GCstr *pGVar2;
  ulong uVar3;
  char *in_RSI;
  long in_RDI;
  GCstr *s;
  lua_State *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  if (in_RSI == (char *)0x0) {
    *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4) = 0xffffffff;
  }
  else {
    if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
        *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
      lj_gc_step(in_stack_ffffffffffffff78);
    }
    strlen(in_RSI);
    pGVar2 = lj_str_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd0);
    puVar1 = *(undefined4 **)(in_RDI + 0x18);
    *puVar1 = (int)pGVar2;
    puVar1[1] = 0xfffffffb;
  }
  uVar3 = *(long *)(in_RDI + 0x18) + 8;
  *(ulong *)(in_RDI + 0x18) = uVar3;
  if (*(uint *)(in_RDI + 0x20) <= uVar3) {
    lj_state_growstack1((lua_State *)0x10ceea);
  }
  return;
}

Assistant:

LUA_API void lua_pushstring(lua_State *L, const char *str)
{
  if (str == NULL) {
    setnilV(L->top);
  } else {
    GCstr *s;
    lj_gc_check(L);
    s = lj_str_newz(L, str);
    setstrV(L, L->top, s);
  }
  incr_top(L);
}